

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzchangeel.cpp
# Opt level: O0

TPZGeoEl * TPZChangeEl::ChangeToGeoBlend(TPZGeoMesh *Mesh,int64_t ElemIndex)

{
  int iVar1;
  int iVar2;
  TPZGeoEl **ppTVar3;
  ostream *poVar4;
  long lVar5;
  long *plVar6;
  TPZGeoEl *pTVar7;
  TPZGeoMesh *in_RDI;
  TPZGeoElSide neigh;
  int s_1;
  TPZGeoEl *NewElem;
  int i;
  TPZManVector<long,_10> nodeindexes;
  int nnodes;
  TPZGeoElSide mySide;
  int s;
  TPZVec<TPZGeoElSide> oldNeigh;
  int nsides;
  int64_t oldMatId;
  int64_t oldId;
  MElementType oldType;
  TPZGeoEl *OldElem;
  TPZGeoElSide *in_stack_fffffffffffffe78;
  TPZGeoElSide *pTVar8;
  TPZManVector<long,_10> *in_stack_fffffffffffffe80;
  TPZGeoEl *in_stack_fffffffffffffe88;
  TPZGeoElSide *in_stack_fffffffffffffe90;
  int64_t in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  TPZSavable in_stack_fffffffffffffeb0;
  TPZGeoEl *in_stack_fffffffffffffeb8;
  TPZGeoMesh *in_stack_fffffffffffffec0;
  int local_134;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  int iVar9;
  TPZVec<TPZGeoElSide> *in_stack_fffffffffffffee0;
  int local_64;
  TPZVec<TPZGeoElSide> local_60;
  int local_3c;
  ulong local_38;
  int64_t local_30;
  uint local_24;
  TPZGeoEl *local_20;
  TPZGeoMesh *local_10;
  TPZGeoEl *local_8;
  undefined4 extraout_var;
  
  local_10 = in_RDI;
  TPZGeoMesh::ElementVec(in_RDI);
  ppTVar3 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      ((TPZChunkVector<TPZGeoEl_*,_10> *)
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       in_stack_fffffffffffffe98);
  local_20 = *ppTVar3;
  if (local_20 == (TPZGeoEl *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error at ");
    poVar4 = std::operator<<(poVar4,
                             "static TPZGeoEl *TPZChangeEl::ChangeToGeoBlend(TPZGeoMesh *, int64_t)"
                            );
    std::operator<<(poVar4," - NULL geometric element.\n");
    local_8 = (TPZGeoEl *)0x0;
  }
  else {
    local_24 = (**(code **)(*(long *)local_20 + 0xb8))();
    local_30 = TPZGeoEl::Id(local_20);
    iVar1 = TPZGeoEl::MaterialId(local_20);
    local_38 = (ulong)iVar1;
    local_3c = (**(code **)(*(long *)local_20 + 0xf0))();
    TPZVec<TPZGeoElSide>::TPZVec
              (in_stack_fffffffffffffee0,
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    for (local_64 = 0; local_64 < local_3c; local_64 = local_64 + 1) {
      TPZGeoElSide::TPZGeoElSide
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
      TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffe88);
      TPZVec<TPZGeoElSide>::operator[](&local_60,(long)local_64);
      TPZGeoElSide::operator=((TPZGeoElSide *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x18038fc);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1803909);
    }
    iVar2 = (**(code **)(*(long *)local_20 + 0x98))();
    iVar1 = iVar2;
    TPZManVector<long,_10>::TPZManVector
              ((TPZManVector<long,_10> *)CONCAT44(iVar2,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe98);
    for (iVar9 = 0; iVar9 < iVar2; iVar9 = iVar9 + 1) {
      lVar5 = (**(code **)(*(long *)local_20 + 0xa8))(local_20,iVar9);
      plVar6 = TPZVec<long>::operator[]((TPZVec<long> *)&stack0xfffffffffffffee0,(long)iVar9);
      *plVar6 = lVar5;
    }
    TPZGeoMesh::DeleteElement
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               (int64_t)in_stack_fffffffffffffeb0._vptr_TPZSavable);
    iVar2 = (*(local_10->super_TPZSavable)._vptr_TPZSavable[0xd])
                      (local_10,(ulong)local_24,&stack0xfffffffffffffee0,local_38 & 0xffffffff,
                       &local_30);
    pTVar7 = (TPZGeoEl *)CONCAT44(extraout_var,iVar2);
    for (local_134 = 0; local_134 < local_3c; local_134 = local_134 + 1) {
      in_stack_fffffffffffffe80 =
           (TPZManVector<long,_10> *)TPZVec<TPZGeoElSide>::operator[](&local_60,(long)local_134);
      pTVar8 = (TPZGeoElSide *)&stack0xfffffffffffffeb0;
      TPZGeoElSide::TPZGeoElSide((TPZGeoElSide *)in_stack_fffffffffffffe80,pTVar8);
      (**(code **)(*(long *)pTVar7 + 0x198))(pTVar7,local_134,pTVar8);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1803af8);
    }
    TPZGeoEl::BuildBlendConnectivity((TPZGeoEl *)in_stack_fffffffffffffe80);
    local_8 = pTVar7;
    TPZManVector<long,_10>::~TPZManVector(in_stack_fffffffffffffe80);
    TPZVec<TPZGeoElSide>::~TPZVec((TPZVec<TPZGeoElSide> *)CONCAT44(iVar1,in_stack_fffffffffffffea0))
    ;
  }
  return local_8;
}

Assistant:

TPZGeoEl * TPZChangeEl::ChangeToGeoBlend(TPZGeoMesh *Mesh, int64_t ElemIndex)
{
	TPZGeoEl * OldElem = Mesh->ElementVec()[ElemIndex];
	if(!OldElem)
    {
		PZError << "Error at " << __PRETTY_FUNCTION__ << " - NULL geometric element.\n";
		return NULL;
	}
    MElementType oldType = OldElem->Type();
    int64_t oldId = OldElem->Id();
    int64_t oldMatId = OldElem->MaterialId();
    int nsides = OldElem->NSides();
    
    TPZVec<TPZGeoElSide> oldNeigh(nsides);
    for(int s = 0; s < nsides; s++)
    {   
        TPZGeoElSide mySide(OldElem, s);
        oldNeigh[s] = mySide.Neighbour();
    }
	
	const int nnodes = OldElem->NCornerNodes();
	TPZManVector<int64_t> nodeindexes(nnodes);
	for(int i = 0; i < nnodes; i++)
    {
        nodeindexes[i] = OldElem->NodeIndex(i);
    }
    
    Mesh->DeleteElement(OldElem);
    
	TPZGeoEl * NewElem = Mesh->CreateGeoBlendElement(oldType, nodeindexes, oldMatId, oldId);

    for(int s = 0; s < nsides; s++)
    {   
        TPZGeoElSide neigh = oldNeigh[s];
        NewElem->SetNeighbour(s, neigh);
    }
    
	NewElem->BuildBlendConnectivity();
	
	return NewElem;
}